

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O3

int av1_set_internal_size
              (AV1EncoderConfig *oxcf,ResizePendingParams *resize_pending_params,
              AOM_SCALING_MODE horiz_mode,AOM_SCALING_MODE vert_mode)

{
  int iVar1;
  
  iVar1 = -1;
  if (vert_mode < (AOME_ONETHREE|AOME_FOURFIVE) && horiz_mode < (AOME_ONETHREE|AOME_FOURFIVE)) {
    iVar1 = *(int *)(&DAT_004da9e4 + (ulong)vert_mode * 4);
    resize_pending_params->width =
         (*(int *)(&DAT_004da9e4 + (ulong)horiz_mode * 4) +
          (oxcf->frm_dim_cfg).width * *(int *)(&DAT_004da9c0 + (ulong)horiz_mode * 4) + -1) /
         *(int *)(&DAT_004da9e4 + (ulong)horiz_mode * 4);
    resize_pending_params->height =
         ((oxcf->frm_dim_cfg).height * *(int *)(&DAT_004da9c0 + (ulong)vert_mode * 4) + iVar1 + -1)
         / iVar1;
    iVar1 = 0;
    if (vert_mode != AOME_NORMAL || horiz_mode != AOME_NORMAL) {
      (oxcf->resize_cfg).resize_mode = '\x01';
      (oxcf->algo_cfg).enable_tpl_model = false;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int av1_set_internal_size(AV1EncoderConfig *const oxcf,
                          ResizePendingParams *resize_pending_params,
                          AOM_SCALING_MODE horiz_mode,
                          AOM_SCALING_MODE vert_mode) {
  int hr = 0, hs = 0, vr = 0, vs = 0;

  // Checks for invalid AOM_SCALING_MODE values.
  if (horiz_mode > AOME_ONETHREE || vert_mode > AOME_ONETHREE) return -1;

  Scale2Ratio(horiz_mode, &hr, &hs);
  Scale2Ratio(vert_mode, &vr, &vs);

  // always go to the next whole number
  resize_pending_params->width = (hs - 1 + oxcf->frm_dim_cfg.width * hr) / hs;
  resize_pending_params->height = (vs - 1 + oxcf->frm_dim_cfg.height * vr) / vs;

  if (horiz_mode != AOME_NORMAL || vert_mode != AOME_NORMAL) {
    oxcf->resize_cfg.resize_mode = RESIZE_FIXED;
    oxcf->algo_cfg.enable_tpl_model = 0;
  }
  return 0;
}